

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall luna::Lexer::Lexer(Lexer *this,State *state,String *module,CharInStream *in)

{
  function<int_()> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  function<int_()> *in_RDI;
  
  *(undefined8 *)&(in_RDI->super__Function_base)._M_functor = in_RSI;
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = in_RDX;
  std::function<int_()>::function(in_RCX,in_RDI);
  *(undefined4 *)&in_RDI[1].super__Function_base._M_manager = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[1].super__Function_base._M_manager + 4) = 1;
  *(undefined4 *)&in_RDI[1]._M_invoker = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  return;
}

Assistant:

Lexer::Lexer(State *state, String *module, CharInStream in)
        : state_(state),
          module_(module),
          in_stream_(in),
          current_(EOF),
          line_(1),
          column_(0)
    {
    }